

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (instance *this,type_info *find_type,bool throw_if_missing)

{
  bool bVar1;
  value_and_holder *pvVar2;
  byte in_CL;
  type_info *in_RDX;
  instance *in_RSI;
  value_and_holder *in_RDI;
  iterator it;
  values_and_holders vhs;
  instance *in_stack_ffffffffffffff58;
  value_and_holder *this_00;
  iterator local_88;
  type_info *in_stack_ffffffffffffffa8;
  values_and_holders *in_stack_ffffffffffffffb0;
  
  if ((in_RDX == (type_info *)0x0) || ((in_RSI->ob_base).ob_type == in_RDX->type)) {
    value_and_holder::value_and_holder(in_RDI,in_RSI,in_RDX,0,0);
  }
  else {
    this_00 = in_RDI;
    values_and_holders::values_and_holders((values_and_holders *)in_RDI,in_stack_ffffffffffffff58);
    values_and_holders::find(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    values_and_holders::end((values_and_holders *)this_00);
    bVar1 = values_and_holders::iterator::operator!=((iterator *)&stack0xffffffffffffffa8,&local_88)
    ;
    if (bVar1) {
      pvVar2 = values_and_holders::iterator::operator*((iterator *)&stack0xffffffffffffffa8);
      this_00->inst = pvVar2->inst;
      this_00->index = pvVar2->index;
      this_00->type = pvVar2->type;
      this_00->vh = pvVar2->vh;
    }
    else {
      if ((in_CL & 1) != 0) {
        pybind11_fail((char *)in_RSI);
      }
      memset(this_00,0,0x20);
      value_and_holder::value_and_holder(this_00);
    }
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            get_fully_qualified_tp_name(find_type->type) + "' is not a pybind11 base of the given `" +
            get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#endif
}